

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void * __thiscall
c4::MemoryResourceLinear::do_reallocate
          (MemoryResourceLinear *this,void *ptr,size_t oldsz,size_t newsz,size_t alignment)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  code *UNRECOVERED_JUMPTABLE;
  void *pvVar4;
  
  if (newsz != oldsz) {
    pcVar2 = (this->super__MemoryResourceSingleChunk).m_mem;
    sVar3 = (this->super__MemoryResourceSingleChunk).m_pos;
    pcVar1 = pcVar2 + sVar3;
    if (newsz < oldsz) {
      if (pcVar1 != (char *)((long)ptr + oldsz)) {
        return ptr;
      }
    }
    else if ((pcVar1 != (char *)((long)ptr + oldsz)) ||
            (pcVar2 + (this->super__MemoryResourceSingleChunk).m_size < (char *)((long)ptr + newsz))
            ) {
      UNRECOVERED_JUMPTABLE = *(code **)(*(long *)&this->super__MemoryResourceSingleChunk + 0x10);
      pvVar4 = (void *)(*UNRECOVERED_JUMPTABLE)
                                 (this,newsz,alignment,ptr,alignment,UNRECOVERED_JUMPTABLE);
      return pvVar4;
    }
    (this->super__MemoryResourceSingleChunk).m_pos = (newsz - oldsz) + sVar3;
  }
  return ptr;
}

Assistant:

void* MemoryResourceLinear::do_reallocate(void* ptr, size_t oldsz, size_t newsz, size_t alignment)
{
    if(newsz == oldsz) return ptr;
    // is ptr the most recently allocated (MRA) block?
    char *cptr = (char*)ptr;
    bool same_pos = (m_mem + m_pos == cptr + oldsz);
    // no need to get more memory when shrinking
    if(newsz < oldsz)
    {
        // if this is the MRA, we can safely shrink the position
        if(same_pos)
        {
            m_pos -= oldsz - newsz;
        }
        return ptr;
    }
    // we're growing the block, and it fits in size
    else if(same_pos && cptr + newsz <= m_mem + m_size)
    {
        // if this is the MRA, we can safely shrink the position
        m_pos += newsz - oldsz;
        return ptr;
    }
    // we're growing the block or it doesn't fit -
    // delegate any of these situations to do_deallocate()
    return do_allocate(newsz, alignment, ptr);
}